

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

void art_iterator_insert(art_t *art,art_iterator_t *iterator,art_key_chunk_t *key,art_val_t *val)

{
  art_node_t *node;
  
  *(undefined2 *)(val->key + 4) = *(undefined2 *)(key + 4);
  *(undefined4 *)val->key = *(undefined4 *)key;
  if (art->root == (art_node_t *)0x0) {
    node = (art_node_t *)((ulong)val | 1);
  }
  else {
    node = art_insert_at(art->root,key,'\0',val);
  }
  art->root = node;
  iterator->depth = '\0';
  iterator->frame = '\0';
  art_node_iterator_lower_bound(node,iterator,key);
  return;
}

Assistant:

void art_iterator_insert(art_t *art, art_iterator_t *iterator,
                         const art_key_chunk_t *key, art_val_t *val) {
    // TODO: This can likely be faster.
    art_insert(art, key, val);
    assert(art->root != NULL);
    iterator->frame = 0;
    iterator->depth = 0;
    art_node_iterator_lower_bound(art->root, iterator, key);
}